

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool __thiscall
tcu::isLinearRangeValid
          (tcu *this,LookupPrecision *prec,Vec4 *c0,Vec4 *c1,Vec2 *fBounds,Vec4 *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  bool bVar5;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float fVar6;
  Vec4 rMax;
  Vec4 rMin;
  Vec4 i1;
  Vec4 i0;
  
  fVar6 = 1.0 - in_XMM0_Da;
  i0.m_data[0] = c0->m_data[0] * in_XMM0_Da + (float)(prec->coordBits).m_data[0] * fVar6;
  i0.m_data[1] = c0->m_data[1] * in_XMM0_Da + (float)(prec->coordBits).m_data[1] * fVar6;
  i0.m_data[2] = c0->m_data[2] * in_XMM0_Da + (float)(prec->coordBits).m_data[2] * fVar6;
  i0.m_data[3] = c0->m_data[3] * in_XMM0_Da + (float)(prec->uvwBits).m_data[0] * fVar6;
  fVar6 = 1.0 - in_XMM1_Da;
  i1.m_data[0] = c0->m_data[0] * in_XMM1_Da + (float)(prec->coordBits).m_data[0] * fVar6;
  i1.m_data[1] = c0->m_data[1] * in_XMM1_Da + (float)(prec->coordBits).m_data[1] * fVar6;
  i1.m_data[2] = c0->m_data[2] * in_XMM1_Da + (float)(prec->coordBits).m_data[2] * fVar6;
  i1.m_data[3] = c0->m_data[3] * in_XMM1_Da + (float)(prec->uvwBits).m_data[0] * fVar6;
  rMin.m_data[1] = c1->m_data[1] - *(float *)(this + 0x1c);
  rMin.m_data[0] = c1->m_data[0] - *(float *)(this + 0x18);
  rMin.m_data[3] = c1->m_data[3] - *(float *)(this + 0x24);
  rMin.m_data[2] = c1->m_data[2] - *(float *)(this + 0x20);
  rMax.m_data[1] = *(float *)(this + 0x1c) + c1->m_data[1];
  rMax.m_data[0] = *(float *)(this + 0x18) + c1->m_data[0];
  rMax.m_data[3] = *(float *)(this + 0x24) + c1->m_data[3];
  rMax.m_data[2] = *(float *)(this + 0x20) + c1->m_data[2];
  uVar4 = 0;
  bVar5 = false;
  do {
    if (this[uVar4 + 0x28] == (tcu)0x1) {
      fVar6 = i0.m_data[uVar4];
      fVar1 = rMin.m_data[uVar4];
      fVar2 = i1.m_data[uVar4];
      if (fVar6 < fVar1 != fVar1 <= fVar2) {
        fVar3 = rMax.m_data[uVar4];
        if ((fVar3 < fVar2 == fVar3 < fVar6) && (fVar1 <= fVar2 == fVar3 < fVar6)) {
          return bVar5;
        }
      }
    }
    bVar5 = 2 < uVar4;
    uVar4 = uVar4 + 1;
    if (uVar4 == 4) {
      return bVar5;
    }
  } while( true );
}

Assistant:

static bool isLinearRangeValid (const LookupPrecision&	prec,
								const Vec4&				c0,
								const Vec4&				c1,
								const Vec2&				fBounds,
								const Vec4&				result)
{
	// This is basically line segment - AABB test. Valid interpolation line is checked
	// against result AABB constructed by applying threshold.

	const Vec4		i0				= c0*(1.0f - fBounds[0]) + c1*fBounds[0];
	const Vec4		i1				= c0*(1.0f - fBounds[1]) + c1*fBounds[1];
	const Vec4		rMin			= result - prec.colorThreshold;
	const Vec4		rMax			= result + prec.colorThreshold;
	bool			allIntersect	= true;

	// Algorithm: For each component check whether segment endpoints are inside, or intersect with slab.
	// If all intersect or are inside, line segment intersects the whole 4D AABB.
	for (int compNdx = 0; compNdx < 4; compNdx++)
	{
		if (!prec.colorMask[compNdx])
			continue;

		// Signs for both bounds: false = left, true = right.
		const bool	sMin0	= i0[compNdx] >= rMin[compNdx];
		const bool	sMin1	= i1[compNdx] >= rMin[compNdx];
		const bool	sMax0	= i0[compNdx] > rMax[compNdx];
		const bool	sMax1	= i1[compNdx] > rMax[compNdx];

		// If all signs are equal, line segment is outside bounds.
		if (sMin0 == sMin1 && sMin1 == sMax0 && sMax0 == sMax1)
		{
			allIntersect = false;
			break;
		}
	}

	return allIntersect;
}